

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_block.cpp
# Opt level: O0

BlockInformationStruct *
cfd::js::api::ElementsBlockStructApi::GetBlockInfo
          (BlockInformationStruct *__return_storage_ptr__,BlockDataStruct *request)

{
  BlockDataStruct *this;
  string *in_R8;
  allocator local_1b9;
  function<cfd::js::api::BlockInformationStruct_(const_cfd::js::api::BlockDataStruct_&)> local_1b8;
  undefined1 local_198 [382];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  BlockDataStruct *pBStack_18;
  anon_class_1_0_00000001 call_func;
  BlockDataStruct *request_local;
  BlockInformationStruct *result;
  
  local_1a = 0;
  pBStack_18 = request;
  BlockInformationStruct::BlockInformationStruct(__return_storage_ptr__);
  this = pBStack_18;
  std::function<cfd::js::api::BlockInformationStruct(cfd::js::api::BlockDataStruct_const&)>::
  function<cfd::js::api::ElementsBlockStructApi::GetBlockInfo(cfd::js::api::BlockDataStruct_const&)::__0&,void>
            ((function<cfd::js::api::BlockInformationStruct(cfd::js::api::BlockDataStruct_const&)> *
             )local_198,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"GetBlockInfo",&local_1b9);
  ExecuteStructApi<cfd::js::api::BlockDataStruct,cfd::js::api::BlockInformationStruct>
            ((BlockInformationStruct *)(local_198 + 0x20),(api *)this,(BlockDataStruct *)local_198,
             &local_1b8,in_R8);
  BlockInformationStruct::operator=
            (__return_storage_ptr__,(BlockInformationStruct *)(local_198 + 0x20));
  BlockInformationStruct::~BlockInformationStruct((BlockInformationStruct *)(local_198 + 0x20));
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::function<cfd::js::api::BlockInformationStruct_(const_cfd::js::api::BlockDataStruct_&)>::
  ~function((function<cfd::js::api::BlockInformationStruct_(const_cfd::js::api::BlockDataStruct_&)>
             *)local_198);
  return __return_storage_ptr__;
}

Assistant:

BlockInformationStruct ElementsBlockStructApi::GetBlockInfo(
    const BlockDataStruct& request) {
  auto call_func =
      [](const BlockDataStruct& request) -> BlockInformationStruct {  // NOLINT
    warn(CFD_LOG_SOURCE, "not implements. block:{}", request.block);
    throw CfdException(CfdError::kCfdIllegalStateError, "Not implements.");
  };

  BlockInformationStruct result;
  result = ExecuteStructApi<BlockDataStruct, BlockInformationStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}